

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

RgbaChannels Imf_3_4::anon_unknown_23::rgbaChannels(ChannelList *ch,string *channelNamePrefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  RgbaChannels RVar3;
  Channel *pCVar4;
  Channel *pCVar5;
  Channel *pCVar6;
  Channel *pCVar7;
  RgbaChannels RVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_58;
  Channel *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  pCVar4 = ChannelList::findChannel(ch,&local_58);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  pCVar5 = ChannelList::findChannel(ch,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  local_38 = pCVar5;
  pCVar5 = ChannelList::findChannel(ch,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  pCVar6 = ChannelList::findChannel(ch,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  pCVar7 = ChannelList::findChannel(ch,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  RVar8 = (pCVar4 != (Channel *)0x0) + WRITE_G;
  if (local_38 == (Channel *)0x0) {
    RVar8 = (uint)(pCVar4 != (Channel *)0x0);
  }
  RVar3 = RVar8 + WRITE_B;
  if (pCVar5 == (Channel *)0x0) {
    RVar3 = RVar8;
  }
  RVar8 = RVar3 + WRITE_A;
  if (pCVar6 == (Channel *)0x0) {
    RVar8 = RVar3;
  }
  RVar3 = RVar8 | WRITE_Y;
  if (pCVar7 == (Channel *)0x0) {
    RVar3 = RVar8;
  }
  return RVar3;
}

Assistant:

RgbaChannels
rgbaChannels (const ChannelList& ch, const string& channelNamePrefix = "")
{
    int i = 0;

    if (ch.findChannel (channelNamePrefix + "R")) i |= WRITE_R;

    if (ch.findChannel (channelNamePrefix + "G")) i |= WRITE_G;

    if (ch.findChannel (channelNamePrefix + "B")) i |= WRITE_B;

    if (ch.findChannel (channelNamePrefix + "A")) i |= WRITE_A;

    if (ch.findChannel (channelNamePrefix + "Y")) i |= WRITE_Y;

    if (ch.findChannel (channelNamePrefix + "RY") ||
        ch.findChannel (channelNamePrefix + "BY"))
        i |= WRITE_C;

    return RgbaChannels (i);
}